

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

reference __thiscall
slang::SmallVectorBase<slang::ast::ConditionalStatement::Condition>::
emplace_back<slang::ast::ConditionalStatement::Condition>
          (SmallVectorBase<slang::ast::ConditionalStatement::Condition> *this,Condition *args)

{
  ulong uVar1;
  pointer p;
  Pattern *pPVar2;
  pointer pCVar3;
  pointer pCVar4;
  pointer pCVar5;
  long lVar6;
  long lVar7;
  pointer __src;
  size_type sVar8;
  ulong uVar9;
  
  __src = this->data_ + this->len;
  if (this->len != this->cap) {
    pPVar2 = args->pattern;
    (__src->expr).ptr = (args->expr).ptr;
    __src->pattern = pPVar2;
    sVar8 = this->len;
    this->len = sVar8 + 1;
    return this->data_ + sVar8;
  }
  if (this->len == 0x7ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar9 = this->len + 1;
  uVar1 = this->cap;
  if (uVar9 < uVar1 * 2) {
    uVar9 = uVar1 * 2;
  }
  if (0x7ffffffffffffff - uVar1 < uVar1) {
    uVar9 = 0x7ffffffffffffff;
  }
  lVar7 = (long)__src - (long)this->data_;
  pCVar3 = (pointer)operator_new(uVar9 << 4);
  pPVar2 = args->pattern;
  *(undefined8 *)((long)pCVar3 + lVar7) = (args->expr).ptr;
  ((undefined8 *)((long)pCVar3 + lVar7))[1] = pPVar2;
  p = this->data_;
  sVar8 = this->len;
  lVar6 = (long)p + (sVar8 * 0x10 - (long)__src);
  pCVar4 = p;
  pCVar5 = pCVar3;
  if (lVar6 == 0) {
    pCVar4 = pCVar3;
    pCVar5 = p;
    if (sVar8 != 0) {
      do {
        pPVar2 = pCVar5->pattern;
        (pCVar4->expr).ptr = (pCVar5->expr).ptr;
        pCVar4->pattern = pPVar2;
        pCVar5 = pCVar5 + 1;
        pCVar4 = pCVar4 + 1;
      } while (pCVar5 != __src);
    }
  }
  else {
    for (; pCVar4 != __src; pCVar4 = pCVar4 + 1) {
      pPVar2 = pCVar4->pattern;
      (pCVar5->expr).ptr = (pCVar4->expr).ptr;
      pCVar5->pattern = pPVar2;
      pCVar5 = pCVar5 + 1;
    }
    memcpy((void *)((long)pCVar3 + lVar7 + 0x10),__src,(lVar6 - 0x10U & 0xfffffffffffffff0) + 0x10);
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
    sVar8 = this->len;
  }
  this->len = sVar8 + 1;
  this->cap = uVar9;
  this->data_ = pCVar3;
  return (reference)((long)pCVar3 + lVar7);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }